

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_short>
          (IntDigits *this,unsigned_short v)

{
  char *pcVar1;
  char *table;
  char *p;
  unsigned_short v_local;
  IntDigits *this_local;
  
  pcVar1 = &this->field_0x3c;
  p._6_2_ = v;
  do {
    table = pcVar1;
    pcVar1 = table + -2;
    *(undefined2 *)pcVar1 =
         *(undefined2 *)(numbers_internal::kHexTable + ((ulong)p._6_2_ & 0xff) * 2);
    p._6_2_ = p._6_2_ >> 8;
  } while (p._6_2_ != 0);
  if (*pcVar1 == '0') {
    pcVar1 = table + -1;
  }
  table = pcVar1;
  this->start_ = table;
  this->size_ = (long)this + (0x3c - (long)table);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }